

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

bool duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::TryGetNextFile
               (MultiFileGlobalState *global_state,unique_lock<std::mutex> *parallel_lock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::MultiFileReaderData_*,_false> _Var2;
  bool bVar3;
  MultiFileReaderData *this;
  pointer *__ptr;
  OpenFileInfo scanned_file;
  _Head_base<0UL,_duckdb::MultiFileReaderData_*,_false> local_58;
  OpenFileInfo local_50;
  
  paVar1 = &local_50.path.field_2;
  local_50.path._M_string_length = 0;
  local_50.path.field_2._M_local_buf[0] = '\0';
  local_50.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_50.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50.path._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = MultiFileList::Scan(global_state->file_list,&global_state->file_list_scan,&local_50);
  if (bVar3) {
    this = (MultiFileReaderData *)operator_new(0xa0);
    MultiFileReaderData::MultiFileReaderData(this,&local_50);
    local_58._M_head_impl = this;
    ::std::
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
              ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                *)&global_state->readers,
               (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                *)&local_58);
    _Var2._M_head_impl = local_58._M_head_impl;
    if (local_58._M_head_impl != (MultiFileReaderData *)0x0) {
      MultiFileReaderData::~MultiFileReaderData(local_58._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
  }
  if (local_50.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_50.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.path._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.path._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

static bool TryGetNextFile(MultiFileGlobalState &global_state, unique_lock<mutex> &parallel_lock) {
		D_ASSERT(parallel_lock.owns_lock());
		OpenFileInfo scanned_file;
		if (!global_state.file_list.Scan(global_state.file_list_scan, scanned_file)) {
			return false;
		}

		// Push the file in the reader data, to be opened later
		global_state.readers.push_back(make_uniq<MultiFileReaderData>(scanned_file));

		return true;
	}